

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O3

void pop_up_invoke_options_proc(Am_Object *cmd)

{
  long lVar1;
  Am_Slot_Key AVar2;
  int value;
  Am_Wrapper *value_00;
  Am_Value *pAVar3;
  Am_Object match_command;
  Am_Object invoke_window;
  Am_Input_Char accel_char;
  Am_Object script_execute_command;
  Am_Object script_window;
  char accel_string [38];
  Am_Object local_70;
  Am_Object local_68;
  Am_Input_Char local_5c;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48 [6];
  
  Am_Object::Get_Object(local_48,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)local_48,10);
  Am_Object::~Am_Object(local_48);
  am_get_db_from_list(&local_68,(Am_Value_List *)&am_invoke_window,(int *)&invoke_windows);
  AVar2 = Am_SCRIPT_WINDOW;
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(&local_68,AVar2,value_00,0);
  pAVar3 = Am_Object::Get(&local_50,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_58,pAVar3);
  AVar2 = Am_INVOKE_MATCH_COMMAND;
  pAVar3 = Am_Object::Get(&local_58,Am_BEFORE_OR_AFTER_COMMAND,0);
  Am_Object::Set(&local_68,AVar2,pAVar3,0);
  pAVar3 = Am_Object::Get(&local_58,0x152,0);
  lVar1 = (pAVar3->value).long_value;
  if ((lVar1 != 0) && (pAVar3->type != Am_Input_Char::Am_Input_Char_ID)) {
    Am_Error();
  }
  local_5c.code = (short)lVar1;
  local_5c._2_2_ = (ushort)((ulong)lVar1 >> 0x10) & 0xfff | local_5c._2_2_ & 0xf000;
  if (local_5c.code == 0) {
    local_48[0].data._0_1_ = 0;
  }
  else {
    Am_Input_Char::As_Short_String(&local_5c,(char *)local_48);
  }
  Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_68,(ulong)Am_DO_ACCELERATOR);
  Am_Object::Set(&local_70,0x169,local_5c.code != 0,0);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_68,0x152);
  Am_Object::Set(&local_70,0x169,(char *)local_48,0);
  Am_Object::~Am_Object(&local_70);
  pAVar3 = Am_Object::Get(&local_58,Am_BEFORE_OR_AFTER,0);
  value = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_68,(ulong)Am_BEFORE_OR_AFTER);
  Am_Object::Set(&local_70,0x169,value,0);
  Am_Object::~Am_Object(&local_70);
  if (value == 0) {
    Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_68,(ulong)Am_UNDO_SCROLL_GROUP);
    Am_Object::Set(&local_70,0xa2,0,0);
  }
  else {
    pAVar3 = Am_Object::Get(&local_58,Am_BEFORE_OR_AFTER_COMMAND,0);
    Am_Object::Am_Object(&local_70,pAVar3);
    am_set_commands_into_script_window(&local_68,&local_70);
  }
  Am_Object::~Am_Object(&local_70);
  Am_Object::Set(&local_68,0x69,true,0);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, pop_up_invoke_options, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object invoke_window = get_invoke_window();
  invoke_window.Set(Am_SCRIPT_WINDOW, script_window);

  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  invoke_window.Set(Am_INVOKE_MATCH_COMMAND,
                    script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND));

  //deal with accel chars
  Am_Input_Char accel_char = script_execute_command.Get(Am_ACCELERATOR);
  char accel_string[Am_LONGEST_CHAR_STRING];
  if (accel_char.Valid())
    accel_char.As_Short_String(accel_string);
  else
    accel_string[0] = 0; //zero length string;
  invoke_window.Get_Object(Am_DO_ACCELERATOR).Set(Am_VALUE, accel_char.Valid());
  invoke_window.Get_Object(Am_ACCELERATOR).Set(Am_VALUE, accel_string);

  // deal with before/after commands
  int before_after = script_execute_command.Get(Am_BEFORE_OR_AFTER);
  invoke_window.Get_Object(Am_BEFORE_OR_AFTER).Set(Am_VALUE, before_after);
  if (before_after != 0) {
    Am_Object match_command =
        script_execute_command.Get(Am_BEFORE_OR_AFTER_COMMAND);
    am_set_commands_into_script_window(invoke_window, match_command);
  } else
    invoke_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_ITEMS, (0L));
  invoke_window.Set(Am_VISIBLE, true);
}